

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O2

void QApplication::setFont(QFont *font,char *className)

{
  QObject *pQVar1;
  QWidget **ppQVar2;
  char cVar3;
  QHash<QByteArray,QFont> *this;
  long lVar4;
  undefined8 *puVar5;
  QFont *this_00;
  long lVar6;
  long lVar7;
  undefined8 *puVar8;
  long in_FS_OFFSET;
  undefined1 *local_68;
  undefined1 *puStack_60;
  QArrayDataPointer<QWidget_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this = (QHash<QByteArray,QFont> *)
         QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_app_fonts>_>::operator()
                   ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_app_fonts>_>
                     *)font);
  if (className == (char *)0x0) {
    QGuiApplication::setFont(font);
    if (((this != (QHash<QByteArray,QFont> *)0x0) && (*(long *)this != 0)) &&
       (*(long *)(*(long *)this + 8) != 0)) {
      QHash<QByteArray,_QFont>::clear((QHash<QByteArray,_QFont> *)this);
    }
  }
  else if (this != (QHash<QByteArray,QFont> *)0x0) {
    QByteArray::QByteArray((QByteArray *)&local_58,className,-1);
    QHash<QByteArray,QFont>::emplace<QFont_const&>(this,(QByteArray *)&local_58,font);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
  }
  if (((char)QCoreApplicationPrivate::is_app_running == '\x01') &&
     ((char)QCoreApplicationPrivate::is_app_closing == '\0')) {
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_68,ApplicationFontChange);
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
    allWidgets();
    ppQVar2 = local_58.ptr;
    lVar7 = local_58.size << 3;
    for (lVar6 = 0; lVar7 != lVar6; lVar6 = lVar6 + 8) {
      pQVar1 = *(QObject **)((long)ppQVar2 + lVar6);
      if ((*(byte *)(*(long *)(pQVar1 + 0x20) + 0xc) & 1) == 0) {
        lVar4 = (**(code **)(*(long *)pQVar1 + 8))(pQVar1,className);
        if (lVar4 != 0) {
          QCoreApplication::sendEvent(pQVar1,(QEvent *)&local_68);
        }
      }
    }
    lVar6 = *(long *)(QCoreApplication::self + 8);
    puVar5 = *(undefined8 **)(lVar6 + 0x180);
    for (puVar8 = puVar5; puVar8 != puVar5 + *(long *)(lVar6 + 0x188); puVar8 = puVar8 + 1) {
      QCoreApplication::sendEvent((QObject *)*puVar8,(QEvent *)&local_68);
      puVar5 = *(undefined8 **)(lVar6 + 0x180);
    }
    QArrayDataPointer<QWidget_*>::~QArrayDataPointer(&local_58);
    QEvent::~QEvent((QEvent *)&local_68);
  }
  if (className == (char *)0x0) {
    if (QApplicationPrivate::sys_font != (QFont *)0x0) {
      cVar3 = QFont::isCopyOf(font);
      if (cVar3 != '\0') goto LAB_002bc71e;
    }
    if (QApplicationPrivate::set_font == (QFont *)0x0) {
      this_00 = (QFont *)operator_new(0x10);
      QFont::QFont(this_00,font);
      QApplicationPrivate::set_font = this_00;
    }
    else {
      QFont::operator=(QApplicationPrivate::set_font,font);
    }
  }
LAB_002bc71e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QApplication::setFont(const QFont &font, const char *className)
{
    FontHash *hash = app_fonts();
    if (!className) {
        QGuiApplication::setFont(font);
        if (hash && hash->size())
            hash->clear();
    } else if (hash) {
        hash->insert(className, font);
    }
    if (QApplicationPrivate::is_app_running && !QApplicationPrivate::is_app_closing) {
        QEvent e(QEvent::ApplicationFontChange);
        QWidgetList wids = QApplication::allWidgets();
        for (QWidgetList::ConstIterator it = wids.constBegin(), cend = wids.constEnd(); it != cend; ++it) {
            QWidget *w = *it;
            if (!w->isWindow() && w->inherits(className)) // matching class
                sendEvent(w, &e);
        }

#if QT_CONFIG(graphicsview)
        // Send to all scenes as well.
        QList<QGraphicsScene *> &scenes = qApp->d_func()->scene_list;
        for (QList<QGraphicsScene *>::ConstIterator it = scenes.constBegin();
             it != scenes.constEnd(); ++it) {
            QCoreApplication::sendEvent(*it, &e);
        }
#endif // QT_CONFIG(graphicsview)
    }
    if (!className && (!QApplicationPrivate::sys_font || !font.isCopyOf(*QApplicationPrivate::sys_font))) {
        if (!QApplicationPrivate::set_font)
            QApplicationPrivate::set_font = new QFont(font);
        else
            *QApplicationPrivate::set_font = font;
    }
}